

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O0

size_t ht_registry_push_registry_klasses_to_listener
                 (HT_TimelineListenerCallback callback,void *listener,HT_Boolean serialize)

{
  size_t sVar1;
  size_t local_1040;
  size_t data_pos;
  HT_Byte data [4096];
  size_t local_30;
  size_t total_size;
  size_t i;
  HT_Boolean serialize_local;
  void *listener_local;
  HT_TimelineListenerCallback callback_local;
  
  local_30 = 0;
  local_1040 = 0;
  ht_mutex_lock(event_klass_registry_register_mutex);
  for (total_size = 0; total_size < event_klass_register.size; total_size = total_size + 1) {
    sVar1 = _ht_registry_push_class_to_listener
                      ((HT_EventKlass *)event_klass_register.data[total_size],(HT_Byte *)&data_pos,
                       &local_1040,callback,listener,serialize);
    local_30 = sVar1 + local_30;
  }
  ht_mutex_unlock(event_klass_registry_register_mutex);
  if (local_1040 != 0) {
    (*callback)((TEventPtr)&data_pos,local_1040,serialize,listener);
    local_30 = local_1040 + local_30;
  }
  return local_30;
}

Assistant:

size_t
ht_registry_push_registry_klasses_to_listener(HT_TimelineListenerCallback callback, void* listener, HT_Boolean serialize)
{
    size_t i;
    size_t total_size = 0;

    HT_Byte data[REGISTRY_LISETNER_BUFF_SIZE];
    size_t data_pos = 0;

    ht_mutex_lock(event_klass_registry_register_mutex);

    for (i = 0; i < event_klass_register.size; i++)
    {
        total_size += _ht_registry_push_class_to_listener((HT_EventKlass*)event_klass_register.data[i], data, &data_pos, callback, listener, serialize);
    }

    ht_mutex_unlock(event_klass_registry_register_mutex);

    if (data_pos > 0)
    {
        callback(data, data_pos, serialize, listener);
        total_size += data_pos;
    }

    return total_size;
}